

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Ast::print(Ast *this,ostream *os)

{
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *os_local;
  Ast *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  AstNode::print(&this->rootNode,os,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Ast::print(std::ostream &os) {
    this->rootNode.print(os, "");
}